

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O2

int __thiscall cmCPackRPMGenerator::PackageComponents(cmCPackRPMGenerator *this,bool ignoreGroup)

{
  cmCPackLog *pcVar1;
  uint uVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  uint local_2c8;
  allocator local_2c1;
  cmCPackRPMGenerator *local_2c0;
  _Base_ptr local_2b8;
  char *local_2b0 [4];
  _Base_ptr local_290;
  string initialTopLevel;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream cmCPackLog_msg;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator *)local_2b0);
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&initialTopLevel,pcVar3,&local_2c1);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  local_2c0 = this;
  if (ignoreGroup) {
    local_2c8 = 1;
    for (p_Var4 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::string((string *)&local_228,(string *)&initialTopLevel);
      std::__cxx11::string::string((string *)&local_248,(string *)(p_Var4 + 1));
      uVar2 = PackageOnePack(local_2c0,&local_228,&local_248);
      local_2c8 = local_2c8 & uVar2;
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_228);
    }
  }
  else {
    local_2c8 = 1;
    local_290 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    for (local_2b8 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                     super__Rb_tree_header._M_header._M_left; local_2b8 != local_290;
        local_2b8 = (_Base_ptr)std::_Rb_tree_increment(local_2b8)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Packaging component group: ");
      p_Var4 = local_2b8 + 1;
      poVar5 = std::operator<<(poVar5,(string *)p_Var4);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                      ,0x73,local_2b0[0]);
      std::__cxx11::string::~string((string *)local_2b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::__cxx11::string::string((string *)&local_1c8,(string *)&initialTopLevel);
      std::__cxx11::string::string((string *)&local_1e8,(string *)p_Var4);
      uVar2 = PackageOnePack(this,&local_1c8,&local_1e8);
      local_2c8 = local_2c8 & uVar2;
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    for (p_Var4 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if (*(long *)(p_Var4 + 4) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"Component <");
        poVar5 = std::operator<<(poVar5,(string *)(p_Var4 + 2));
        poVar5 = std::operator<<(poVar5,"> does not belong to any group, package it separately.");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = (local_2c0->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                        ,0x82,local_2b0[0]);
        std::__cxx11::string::~string((string *)local_2b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::string::string((string *)&local_268,(string *)&initialTopLevel);
        std::__cxx11::string::string((string *)&local_208,(string *)(p_Var4 + 1));
        uVar2 = PackageOnePack(local_2c0,&local_268,&local_208);
        local_2c8 = local_2c8 & uVar2;
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_268);
      }
    }
  }
  std::__cxx11::string::~string((string *)&initialTopLevel);
  return local_2c8;
}

Assistant:

int cmCPackRPMGenerator::PackageComponents(bool ignoreGroup)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup)
    {
    std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
    for (compGIt=this->ComponentGroups.begin();
        compGIt!=this->ComponentGroups.end(); ++compGIt)
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Packaging component group: "
          << compGIt->first
          << std::endl);
      retval &= PackageOnePack(initialTopLevel,compGIt->first);
      }
    // Handle Orphan components (components not belonging to any groups)
    std::map<std::string, cmCPackComponent>::iterator compIt;
    for (compIt=this->Components.begin();
        compIt!=this->Components.end(); ++compIt )
      {
      // Does the component belong to a group?
      if (compIt->second.Group==NULL)
        {
        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
            "Component <"
            << compIt->second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        retval &= PackageOnePack(initialTopLevel,compIt->first);
        }
      }
    }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else
    {
    std::map<std::string, cmCPackComponent>::iterator compIt;
    for (compIt=this->Components.begin();
         compIt!=this->Components.end(); ++compIt )
      {
      retval &= PackageOnePack(initialTopLevel,compIt->first);
      }
    }
  return retval;
}